

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O2

void __thiscall
axl::sl::
ConstructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
::operator()(ConstructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
             *this,void *p)

{
  Module *this_00;
  DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
  *p_00;
  Ptr<axl::g::Finalizer> local_20;
  
  *(undefined8 *)p = 0;
  *(undefined8 *)((long)p + 8) = 0;
  *(undefined8 *)((long)p + 0x10) = 0;
  this_00 = g::getModule();
  p_00 = (DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
          *)mem::allocate(0x28);
  (p_00->super_RefCount).m_refCount = 0;
  (p_00->super_RefCount).m_weakRefCount = 1;
  (p_00->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_00198d50;
  (p_00->super_Finalizer)._vptr_Finalizer = (_func_int **)&DAT_00198d78;
  p_00->m_p = (BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
               *)p;
  (p_00->super_RefCount).m_freeFunc = mem::deallocate;
  rc::Ptr<axl::g::Finalizer>::
  Ptr<axl::sl::DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::sl::StringRefBase<char,axl::sl::StringDetailsBase<char>>const&>>>
            (&local_20,p_00);
  g::Module::addFinalizer(this_00,&local_20);
  rc::Ptr<axl::g::Finalizer>::~Ptr(&local_20);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}